

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O2

void __thiscall features::Sift::generate_grad_ori_images(Sift *this,Octave *octave)

{
  ImageVector *this_00;
  ImageVector *this_01;
  long lVar1;
  int width;
  int height;
  long lVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  pointer psVar8;
  float fVar9;
  float __y;
  long local_c0;
  ConstPtr img;
  undefined1 local_68 [8];
  Ptr grad;
  Ptr ori;
  
  this_00 = &octave->grad;
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::clear(this_00);
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::reserve(this_00,(long)(octave->img).
                          super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(octave->img).
                          super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4);
  this_01 = &octave->ori;
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::clear(this_01);
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::reserve(this_01,(long)(octave->img).
                          super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(octave->img).
                          super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar8 = (octave->img).
           super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(psVar8->super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  width = *(int *)(lVar4 + 8);
  height = *(int *)(lVar4 + 0xc);
  for (uVar6 = 0;
      uVar6 < (ulong)((long)(octave->img).
                            super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4);
      uVar6 = uVar6 + 1) {
    std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<core::Image<float>,void>
              ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)&local_c0,
               &psVar8[uVar6].super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>);
    core::Image<float>::create((Image<float> *)local_68,width,height,1);
    core::Image<float>::create
              ((Image<float> *)
               &grad.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               width,height,1);
    iVar5 = 1;
    uVar3 = width + 1;
    while( true ) {
      if (height + -1 <= iVar5) break;
      lVar4 = (long)(int)uVar3;
      img.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar3;
      for (lVar7 = 0; (int)lVar7 + 1 < width + -1; lVar7 = lVar7 + 1) {
        lVar2 = *(long *)(local_c0 + 0x18);
        lVar1 = lVar2 + lVar4 * 4;
        ori.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = (*(float *)(lVar1 + 4 + lVar7 * 4) - *(float *)(lVar1 + -4 + lVar7 * 4)) * 0.5;
        __y = (*(float *)(lVar2 + (long)width * 4 + lVar4 * 4 + lVar7 * 4) -
              *(float *)(lVar2 + (long)width * -4 + lVar4 * 4 + lVar7 * 4)) * 0.5;
        fVar9 = atan2f(__y,ori.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi._4_4_);
        (((TypedImageBase<float> *)local_68)->data).
        super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
        [lVar4 + lVar7] =
             SQRT(ori.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi._4_4_ *
                  ori.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi._4_4_ + __y * __y);
        *(uint *)(*(long *)&grad.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi[1]._M_use_count + lVar4 * 4 + lVar7 * 4) =
             -(uint)(fVar9 < 0.0) & (uint)(fVar9 + 6.2831855) | ~-(uint)(fVar9 < 0.0) & (uint)fVar9;
      }
      iVar5 = iVar5 + 1;
      uVar3 = (int)img.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + (int)lVar7 + 2;
    }
    std::
    vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
    ::push_back(this_00,(value_type *)local_68);
    std::
    vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
    ::push_back(this_01,(value_type *)
                        &grad.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ori);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&grad);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&img);
    psVar8 = (octave->img).
             super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  return;
}

Assistant:

void
Sift::generate_grad_ori_images (Octave* octave)
{
    octave->grad.clear();
    octave->grad.reserve(octave->img.size());
    octave->ori.clear();
    octave->ori.reserve(octave->img.size());

    int const width = octave->img[0]->width();
    int const height = octave->img[0]->height();

    //std::cout << "Generating gradient and orientation images..." << std::endl;
    for (std::size_t i = 0; i < octave->img.size(); ++i)
    {
        core::FloatImage::ConstPtr img = octave->img[i];
        core::FloatImage::Ptr grad = core::FloatImage::create(width, height, 1);
        core::FloatImage::Ptr ori = core::FloatImage::create(width, height, 1);

        int image_iter = width + 1;
        for (int y = 1; y < height - 1; ++y, image_iter += 2)
            for (int x = 1; x < width - 1; ++x, ++image_iter)
            {
                float m1x = img->at(image_iter - 1);
                float p1x = img->at(image_iter + 1);
                float m1y = img->at(image_iter - width);
                float p1y = img->at(image_iter + width);
                float dx = 0.5f * (p1x - m1x);
                float dy = 0.5f * (p1y - m1y);

                float atan2f = std::atan2(dy, dx);
                grad->at(image_iter) = std::sqrt(dx * dx + dy * dy);
                ori->at(image_iter) = atan2f < 0.0f
                    ? atan2f + MATH_PI * 2.0f : atan2f;
            }
        octave->grad.push_back(grad);
        octave->ori.push_back(ori);
    }
}